

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnMap(RenX_LoggingPlugin *this,Server *server,string_view raw)

{
  pointer pcVar1;
  code *pcVar2;
  string msg;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((char)this->field_0xa8 < '\0') {
    pcVar2 = RenX::Server::sendLogChan;
  }
  else {
    pcVar2 = RenX::Server::sendAdmChan;
  }
  pcVar1 = (this->mapFmt)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->mapFmt)._M_string_length);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    RenX::replace_tag(&local_50,*(undefined8 *)(RenX::tags + 0x1510),
                      *(undefined8 *)(RenX::tags + 0x1508),raw._M_len,raw._M_str);
    (*pcVar2)(server,local_48,local_50);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnMap(RenX::Server &server, std::string_view raw)
{
	logFuncType func;
	if (RenX_LoggingPlugin::mapPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->mapFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, raw);
		(server.*func)(msg);
	}
}